

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache.c
# Opt level: O2

int vmemcache_put(VMEMcache *cache,void *key,size_t ksize,void *value,size_t value_size)

{
  int iVar1;
  undefined8 *puVar2;
  ulong uVar3;
  int *piVar4;
  ptr_ext_t *ppVar5;
  size_t __n;
  ulong __n_00;
  size_t sVar6;
  bool bVar7;
  ptr_ext_t *local_48;
  ptr_ext_t *small_extent;
  size_t local_38;
  
  local_38 = value_size;
  puVar2 = (undefined8 *)__tls_get_addr(&PTR_00109fc0);
  if ((((void *)*puVar2 != (void *)0x0) && (puVar2[1] == ksize)) &&
     (iVar1 = bcmp((void *)*puVar2,key,ksize), iVar1 == 0)) {
    *puVar2 = 0;
    uVar3 = local_38 - puVar2[4];
    if (local_38 < (ulong)puVar2[4] || uVar3 == 0) {
      puVar2[3] = 0;
    }
    else {
      __n_00 = puVar2[3];
      if (uVar3 < (ulong)puVar2[3]) {
        puVar2[3] = uVar3;
        __n_00 = uVar3;
      }
      if ((void *)puVar2[2] != (void *)0x0) {
        memcpy((void *)puVar2[2],value,__n_00);
      }
    }
    if ((ulong *)puVar2[5] != (ulong *)0x0) {
      *(ulong *)puVar2[5] = local_38;
    }
  }
  if (cache->size < local_38) {
    out_err("/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/src/vmemcache.c",
            0x152,"vmemcache_put","value larger than entire cache");
    piVar4 = __errno_location();
    *piVar4 = 0x1c;
  }
  else {
    ppVar5 = (ptr_ext_t *)Zalloc(ksize + 0x28);
    if (ppVar5 == (ptr_ext_t *)0x0) {
      out_err("/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/src/vmemcache.c",
              0x15b,"vmemcache_put","!Zalloc");
    }
    else {
      *(size_t *)(ppVar5 + 0x20) = ksize;
      memcpy(ppVar5 + 0x28,key,ksize);
      small_extent = ppVar5;
      if ((cache->field_0x58 & 6) == 0) {
        local_48 = (ptr_ext_t *)0x0;
        sVar6 = local_38;
        while (sVar6 != 0) {
          uVar3 = vmcache_alloc(cache->heap,sVar6,(ptr_ext_t **)(ppVar5 + 0x18),&local_48);
          if ((long)uVar3 < 0) goto LAB_001047b4;
          if ((uVar3 == 0) && (iVar1 = vmemcache_evict(cache,(void *)0x0,0), iVar1 != 0)) {
            piVar4 = __errno_location();
            if (*piVar4 == 3) {
              *piVar4 = 0x1c;
            }
            goto LAB_001047b4;
          }
          bVar7 = sVar6 < uVar3;
          sVar6 = sVar6 - uVar3;
          if (bVar7) {
            sVar6 = 0;
          }
        }
        if ((cache->field_0x58 & 8) == 0) {
          sVar6 = local_38;
          for (ppVar5 = *(ptr_ext_t **)(ppVar5 + 0x18); __n = vmcache_extent_get_size(ppVar5),
              ppVar5 != (ptr_ext_t *)0x0; ppVar5 = vmcache_extent_get_next(ppVar5)) {
            if (sVar6 <= __n) {
              __n = sVar6;
            }
            memcpy(ppVar5,value,__n);
            value = (void *)((long)value + __n);
            sVar6 = sVar6 - __n;
          }
        }
        *(size_t *)(small_extent + 0x10) = local_38;
      }
      iVar1 = vmcache_index_insert(cache->index,(cache_entry *)small_extent);
      if (iVar1 == 0) {
        if ((cache->field_0x58 & 2) != 0) {
          return 0;
        }
        (*cache->repl->ops->repl_p_insert)
                  (cache->repl->head,small_extent,(repl_p_entry **)(small_extent + 8));
        return 0;
      }
LAB_001047b4:
      ppVar5 = small_extent;
      vmcache_free(cache->heap,*(ptr_ext_t **)(small_extent + 0x18));
      free(ppVar5);
    }
  }
  return -1;
}

Assistant:

int
vmemcache_put(VMEMcache *cache, const void *key, size_t ksize,
				const void *value, size_t value_size)
{
	LOG(3, "cache %p key %p ksize %zu value %p value_size %zu",
		cache, key, ksize, value, value_size);

	if (get_req.key)
		vmemcache_put_satisfy_get(key, ksize, value, value_size);

	if (value_size > cache->size) {
		ERR("value larger than entire cache");
		errno = ENOSPC;
		return -1;
	}

	struct cache_entry *entry;

	entry = Zalloc(sizeof(struct cache_entry) + ksize);
	if (entry == NULL) {
		ERR("!Zalloc");
		return -1;
	}

	entry->key.ksize = ksize;
	memcpy(entry->key.key, key, ksize);

	if (cache->index_only || cache->no_alloc)
		goto put_index;

	ptr_ext_t *small_extent = NULL; /* required by vmcache_alloc() */
	size_t left_to_allocate = value_size;

	while (left_to_allocate != 0) {
		ssize_t allocated = vmcache_alloc(cache->heap, left_to_allocate,
							&entry->value.extents,
							&small_extent);
		if (allocated < 0)
			goto error_exit;

		if (allocated == 0 && vmemcache_evict(cache, NULL, 0)) {
			LOG(1, "vmemcache_evict() failed");
			if (errno == ESRCH)
				errno = ENOSPC;
			goto error_exit;
		}

		left_to_allocate -= MIN((size_t)allocated, left_to_allocate);
	}

	if (cache->no_memcpy)
		entry->value.vsize = value_size;
	else
		vmemcache_populate_extents(entry, value, value_size);

put_index:
	if (vmcache_index_insert(cache->index, entry)) {
		LOG(1, "inserting to the index failed");
		goto error_exit;
	}

	if (!cache->index_only) {
		cache->repl->ops->repl_p_insert(cache->repl->head, entry,
					&entry->value.p_entry);
	}

	return 0;

error_exit:
	vmcache_free(cache->heap, entry->value.extents);

	Free(entry);

	return -1;
}